

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O1

void SaveCDT_SnapshotWithPalette(path *fname,aint startAddr,byte screenMode,byte *palette)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  void *__dest;
  CDevicePage *pCVar4;
  undefined2 uVar5;
  long lVar6;
  long lVar7;
  int i_2;
  int iVar8;
  undefined1 *puVar9;
  byte *pbVar10;
  byte *pbVar11;
  int i_1;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  int num;
  byte bVar15;
  uchar *pages_ram [4];
  byte loader [114];
  aint pages_start [4];
  aint pages_len [4];
  int iVar16;
  string local_128;
  long local_108;
  byte *local_100;
  string local_f8;
  byte local_d8 [38];
  bool bStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined2 local_7c;
  undefined1 local_7a [34];
  int aiStack_58 [4];
  int aiStack_48 [6];
  
  bVar15 = 0;
  iVar3 = strcmp(DeviceID,"AMSTRADCPC464");
  __dest = operator_new__(0xc000);
  if (iVar3 == 0) {
    pCVar4 = CDevice::GetPage(Device,0);
    memcpy(__dest,pCVar4->RAM,0x4000);
    pCVar4 = CDevice::GetPage(Device,1);
    memcpy((void *)((long)__dest + 0x4000),pCVar4->RAM,0x4000);
    pCVar4 = CDevice::GetPage(Device,2);
    memcpy((void *)((long)__dest + 0x8000),pCVar4->RAM,0x4000);
    bVar12 = 0xff;
    if (screenMode < 3) {
      bVar12 = screenMode;
    }
    bVar2 = CDTUtil::hasScreen();
    lVar7 = 0;
    do {
      if (*(char *)((long)__dest + lVar7) != '\0') goto LAB_001143bc;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xc000);
    lVar7 = 0x10000;
LAB_001143bc:
    iVar3 = 0xc001;
    lVar6 = 0xc000;
    do {
      if (lVar6 == 0) {
        iVar3 = 0;
        break;
      }
      iVar3 = iVar3 + -1;
      lVar1 = lVar6 + -1;
      lVar6 = lVar6 + -1;
    } while (*(char *)((long)__dest + lVar1) == '\0');
    iVar16 = (int)lVar7;
    if (iVar16 == 0x10000 || iVar3 == 0) {
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      iVar3 = iVar3 - iVar16;
      uVar5 = (undefined2)startAddr;
      if (startAddr < 0) {
        uVar5 = (undefined2)lVar7;
      }
      local_d8[0x20] = 0x80;
      local_d8[0x21] = '>';
      local_d8[0x22] = '\x16';
      local_d8[0x23] = 0xc3;
      local_d8[0x24] = 0xa1;
      local_d8[0x10] = '@';
      local_d8[0x11] = '>';
      local_d8[0x12] = '\x16';
      local_d8[0x13] = 0xcd;
      local_d8[0x14] = 0xa1;
      local_d8[0x15] = 0xbc;
      local_d8[0x16] = '*';
      local_d8[0x17] = '\'';
      local_d8[0x18] = 0x80;
      local_d8[0x19] = 0xe5;
      local_d8[0x1a] = '*';
      local_d8[0x1b] = ')';
      local_d8[0x1c] = 0x80;
      local_d8[0x1d] = 0xed;
      local_d8[0x1e] = '[';
      local_d8[0x1f] = '+';
      local_d8[0] = '>';
      local_d8[1] = 0xff;
      local_d8[2] = 0xcd;
      local_d8[3] = 'k';
      local_d8[4] = 0xbc;
      local_d8[5] = ':';
      local_d8[6] = '&';
      local_d8[7] = 0x80;
      local_d8[8] = 0xb7;
      local_d8[9] = '(';
      local_d8[10] = '\v';
      local_d8[0xb] = '!';
      local_d8[0xc] = '\0';
      local_d8[0xd] = 0xc0;
      local_d8[0xe] = '\x11';
      local_d8[0xf] = '\0';
      stack0xffffffffffffff4d =
           CONCAT17((char)((uint)iVar3 >> 8),
                    CONCAT16((char)iVar3,
                             CONCAT15((char)((ulong)lVar7 >> 8),
                                      CONCAT14((char)lVar7,
                                               CONCAT13((char)((ushort)uVar5 >> 8),
                                                        CONCAT12((char)uVar5,CONCAT11(bVar2,0xbc))))
                                     )));
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,bVar12,palette);
      local_128.field_2._M_allocated_capacity._0_4_ = 0x45444f43;
      local_128._M_string_length = 4;
      local_128.field_2._M_allocated_capacity._4_4_ =
           local_128.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      CDTUtil::writeTapeFile(fname,&local_128,'\x02',local_d8,0x2d,0x8000,0x8000,(word)iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT44(local_128.field_2._M_allocated_capacity._4_4_,
                                 local_128.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar2) {
        pCVar4 = CDevice::GetPage(Device,3);
        pbVar10 = pCVar4->RAM;
        pCVar4 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar10,pCVar4->Size,1000,'\x16');
      }
      CDTUtil::writeChunkedData(fname,(byte *)((long)__dest + (long)iVar16),iVar3,1000,'\x16');
    }
  }
  else {
    pCVar4 = CDevice::GetPage(Device,0);
    memcpy(__dest,pCVar4->RAM,0x4000);
    pCVar4 = CDevice::GetPage(Device,1);
    memcpy((void *)((long)__dest + 0x4000),pCVar4->RAM,0x4000);
    pCVar4 = CDevice::GetPage(Device,2);
    memcpy((void *)((long)__dest + 0x8000),pCVar4->RAM,0x4000);
    bVar12 = 0xff;
    if (screenMode < 3) {
      bVar12 = screenMode;
    }
    bVar2 = CDTUtil::hasScreen();
    lVar7 = 0;
    do {
      if (*(char *)((long)__dest + lVar7) != '\0') goto LAB_001142f4;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xc000);
    lVar7 = 0x10000;
LAB_001142f4:
    iVar3 = 0xc001;
    lVar6 = 0xc000;
    do {
      if (lVar6 == 0) {
        iVar3 = 0;
        break;
      }
      iVar3 = iVar3 + -1;
      lVar1 = lVar6 + -1;
      lVar6 = lVar6 + -1;
    } while (*(char *)((long)__dest + lVar1) == '\0');
    if ((int)lVar7 == 0x10000 || iVar3 == 0) {
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      pbVar10 = SaveCDT_AmstradCPC6128;
      pbVar11 = local_d8;
      for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined8 *)pbVar11 = *(undefined8 *)pbVar10;
        pbVar10 = pbVar10 + ((ulong)bVar15 * -2 + 1) * 8;
        pbVar11 = pbVar11 + ((ulong)bVar15 * -2 + 1) * 8;
      }
      iVar3 = iVar3 - (int)lVar7;
      uVar5 = (undefined2)startAddr;
      if (startAddr < 0) {
        uVar5 = (undefined2)lVar7;
      }
      local_81 = (undefined1)uVar5;
      _local_80 = CONCAT13((char)iVar3,
                           CONCAT12((char)((ulong)lVar7 >> 8),
                                    CONCAT11((char)lVar7,(char)((ushort)uVar5 >> 8))));
      local_7c = (ushort)(byte)((uint)iVar3 >> 8);
      local_108 = lVar7;
      local_100 = palette;
      local_82 = bVar2;
      if (Device->PagesCount < 5) {
        uVar13 = 0;
        iVar16 = 0x5e;
      }
      else {
        iVar16 = 0x5e;
        uVar13 = 0;
        num = 4;
        puVar9 = local_7a;
        do {
          pCVar4 = CDevice::GetPage(Device,num);
          lVar7 = 0;
          do {
            if (pCVar4->RAM[lVar7] != '\0') goto LAB_001144db;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x4000);
          lVar7 = 0x10000;
LAB_001144db:
          pCVar4 = CDevice::GetPage(Device,num);
          iVar8 = 0x4001;
          lVar6 = 0x4000;
          do {
            if (lVar6 == 0) {
              iVar8 = 0;
              break;
            }
            iVar8 = iVar8 + -1;
            lVar1 = lVar6 + -1;
            lVar6 = lVar6 + -1;
          } while (pCVar4->RAM[lVar1] == '\0');
          if (iVar8 != 0 && (int)lVar7 != 0x10000) {
            *puVar9 = (char)num;
            puVar9[1] = (char)lVar7;
            puVar9[2] = (char)((ulong)lVar7 >> 8);
            puVar9[3] = (char)iVar8;
            puVar9[4] = (char)((uint)iVar8 >> 8);
            pCVar4 = CDevice::GetPage(Device,num);
            puVar9 = puVar9 + 5;
            iVar16 = iVar16 + 5;
            (&local_128._M_dataplus)[(int)uVar13]._M_p = (pointer)pCVar4->RAM;
            aiStack_58[(int)uVar13] = (int)lVar7;
            aiStack_48[(int)uVar13] = iVar8;
            uVar13 = uVar13 + 1;
          }
          num = num + 1;
        } while (num < Device->PagesCount);
      }
      local_7c = CONCAT11((char)uVar13,(undefined1)local_7c);
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,bVar12,local_100);
      local_f8.field_2._M_allocated_capacity._0_4_ = 0x45444f43;
      local_f8._M_string_length = 4;
      local_f8.field_2._M_allocated_capacity._4_4_ =
           local_f8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      CDTUtil::writeTapeFile(fname,&local_f8,'\x02',local_d8,iVar16,0x8000,0x8000,(word)iVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                                 local_f8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if (bVar2) {
        pCVar4 = CDevice::GetPage(Device,3);
        pbVar10 = pCVar4->RAM;
        pCVar4 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar10,pCVar4->Size,1000,'\x16');
      }
      if (0 < (int)uVar13) {
        uVar14 = 0;
        do {
          CDTUtil::writeChunkedData
                    (fname,(byte *)((&local_128._M_dataplus)[uVar14]._M_p + aiStack_58[uVar14]),
                     aiStack_48[uVar14],1000,'\x16');
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      CDTUtil::writeChunkedData
                (fname,(byte *)((long)__dest + (long)(int)local_108),iVar3,1000,'\x16');
    }
  }
  operator_delete__(__dest);
  return;
}

Assistant:

static void SaveCDT_SnapshotWithPalette(const std::filesystem::path & fname,
										aint startAddr, byte screenMode, const byte* palette)
{
	isCPC6128() ?
		createCDTDump6128(fname, startAddr, screenMode, palette) :
		createCDTDump464(fname, startAddr, screenMode, palette);
}